

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

void __thiscall Arbitrarysignedchar::~Arbitrarysignedchar(Arbitrarysignedchar *this)

{
  Arbitrarysignedchar *this_local;
  
  ~Arbitrarysignedchar(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(signedchar, Arbitrary)
{
  testinator::Arbitrary<signed char> a;
  signed char v = a.generate(0,0);
  a.shrink(v);
  return true;
}